

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O1

int __thiscall glcts::SampleShadingTests::init(SampleShadingTests *this,EVP_PKEY_CTX *ctx)

{
  GLSLVersion GVar1;
  Context *pCVar2;
  int extraout_EAX;
  TestNode *pTVar3;
  
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,pCVar2->m_testCtx,"api","Basic API verification");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139240;
  *(GLSLVersion *)&pTVar3[1].m_testCtx = GVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,pCVar2->m_testCtx,"render","Sample Shading render tests");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__SampleShadingRenderTests_02139158;
  *(GLSLVersion *)&pTVar3[1].m_testCtx = GVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  return extraout_EAX;
}

Assistant:

void SampleShadingTests::init(void)
{
	// sample_shading.api
	addChild(new SampleShadingApiCaseGroup(m_context, m_glslVersion));
	// sample_shading.render
	addChild(new SampleShadingRenderTests(m_context, m_glslVersion));
}